

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGeneratorFactory.cxx
# Opt level: O2

void __thiscall
cmCPackGeneratorFactory::RegisterGenerator
          (cmCPackGeneratorFactory *this,string *name,char *generatorDescription,
          CreateGeneratorCall *createGenerator)

{
  cmCPackLog *this_00;
  mapped_type *ppCVar1;
  mapped_type *pmVar2;
  ostream *poVar3;
  char *local_1b8 [4];
  ostringstream cmCPackLog_msg;
  
  if (createGenerator != (CreateGeneratorCall *)0x0) {
    ppCVar1 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackGenerator_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackGenerator_*(*)()>_>_>
              ::operator[](&this->GeneratorCreators,name);
    *ppCVar1 = createGenerator;
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->GeneratorDescriptions,name);
    std::__cxx11::string::assign((char *)pmVar2);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
  poVar3 = std::operator<<((ostream *)&cmCPackLog_msg,"Cannot register generator");
  std::endl<char,std::char_traits<char>>(poVar3);
  this_00 = this->Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(this_00,0x10,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGeneratorFactory.cxx"
                  ,0xbd,local_1b8[0]);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  return;
}

Assistant:

void cmCPackGeneratorFactory::RegisterGenerator(
  const std::string& name, const char* generatorDescription,
  CreateGeneratorCall* createGenerator)
{
  if (!createGenerator) {
    cmCPack_Log(this->Logger, cmCPackLog::LOG_ERROR,
                "Cannot register generator" << std::endl);
    return;
  }
  this->GeneratorCreators[name] = createGenerator;
  this->GeneratorDescriptions[name] = generatorDescription;
}